

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cRGBA,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  FSpecialColormap *pFVar4;
  EBlend EVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  byte *pbVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar5 = BLEND_NONE;
  }
  else {
    EVar5 = inf->blend;
  }
  switch(EVar5) {
  case BLEND_NONE:
    if (0 < count) {
      pbVar10 = pin + 3;
      lVar6 = 0;
      do {
        bVar1 = *pbVar10;
        if (bVar1 != 0) {
          uVar9 = (uint)bVar1;
          uVar14 = uVar9 ^ 0xff;
          pout[lVar6 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar14 + pbVar10[-3] * uVar9) * 0x1010102 >>
                     0x20);
          pout[lVar6 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar14 + pbVar10[-2] * uVar9) * 0x1010102 >>
                     0x20);
          pout[lVar6 * 4] =
               (BYTE)((ulong)(pout[lVar6 * 4] * uVar14 + pbVar10[-1] * uVar9) * 0x1010102 >> 0x20);
          pout[lVar6 * 4 + 3] = bVar1;
        }
        lVar6 = lVar6 + 1;
        pbVar10 = pbVar10 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar10 = pin + 3;
      lVar6 = 0;
      do {
        bVar1 = *pbVar10;
        if (bVar1 != 0) {
          uVar14 = (uint)pbVar10[-2] * 0x8f + (uint)pbVar10[-3] * 0x4d +
                   ((uint)pbVar10[-1] + (uint)pbVar10[-1] * 8) * 4 >> 0xc;
          uVar9 = (uint)bVar1;
          uVar13 = uVar9 ^ 0xff;
          pout[lVar6 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar13 + IcePalette[uVar14][0] * uVar9) *
                      0x1010102 >> 0x20);
          pout[lVar6 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar13 + IcePalette[uVar14][1] * uVar9) *
                      0x1010102 >> 0x20);
          pout[lVar6 * 4] =
               (BYTE)((ulong)(pout[lVar6 * 4] * uVar13 + IcePalette[uVar14][2] * uVar9) * 0x1010102
                     >> 0x20);
          pout[lVar6 * 4 + 3] = bVar1;
        }
        lVar6 = lVar6 + 1;
        pbVar10 = pbVar10 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar10 = pin + 3;
      lVar6 = 0;
      do {
        bVar1 = *pbVar10;
        if (bVar1 != 0) {
          iVar11 = inf->blendcolor[3];
          bVar2 = pbVar10[-2];
          iVar7 = inf->blendcolor[1];
          bVar3 = pbVar10[-1];
          iVar8 = inf->blendcolor[2];
          uVar14 = (uint)bVar1;
          uVar9 = uVar14 ^ 0xff;
          pout[lVar6 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar9 +
                             ((uint)pbVar10[-3] * iVar11 + inf->blendcolor[0] >> 0x10 & 0xff) *
                             uVar14) * 0x1010102 >> 0x20);
          pout[lVar6 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar9 +
                             ((uint)bVar2 * iVar11 + iVar7 >> 0x10 & 0xff) * uVar14) * 0x1010102 >>
                     0x20);
          pout[lVar6 * 4] =
               (BYTE)((ulong)(pout[lVar6 * 4] * uVar9 +
                             ((uint)bVar3 * iVar11 + iVar8 >> 0x10 & 0xff) * uVar14) * 0x1010102 >>
                     0x20);
          pout[lVar6 * 4 + 3] = bVar1;
        }
        lVar6 = lVar6 + 1;
        pbVar10 = pbVar10 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar10 = pin + 3;
      lVar6 = 0;
      do {
        bVar1 = *pbVar10;
        if (bVar1 != 0) {
          bVar2 = pbVar10[-2];
          iVar11 = inf->blendcolor[1];
          bVar3 = pbVar10[-1];
          iVar7 = inf->blendcolor[2];
          uVar14 = (uint)bVar1;
          uVar9 = uVar14 ^ 0xff;
          pout[lVar6 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar9 +
                             ((uint)pbVar10[-3] * inf->blendcolor[0] >> 0x10 & 0xff) * uVar14) *
                      0x1010102 >> 0x20);
          pout[lVar6 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar9 +
                             ((uint)bVar2 * iVar11 >> 0x10 & 0xff) * uVar14) * 0x1010102 >> 0x20);
          pout[lVar6 * 4] =
               (BYTE)((ulong)(pout[lVar6 * 4] * uVar9 +
                             ((uint)bVar3 * iVar7 >> 0x10 & 0xff) * uVar14) * 0x1010102 >> 0x20);
          pout[lVar6 * 4 + 3] = bVar1;
        }
        lVar6 = lVar6 + 1;
        pbVar10 = pbVar10 + step;
      } while (count != (int)lVar6);
    }
    break;
  default:
    EVar5 = inf->blend;
    lVar6 = (long)EVar5;
    if (lVar6 < 0x21) {
      if ((BLEND_ICEMAP < EVar5) && (0 < count)) {
        iVar11 = 0x20 - EVar5;
        pbVar10 = pin + 3;
        lVar6 = 0;
        do {
          bVar1 = *pbVar10;
          if (bVar1 != 0) {
            bVar2 = pbVar10[-1];
            iVar8 = ((uint)pbVar10[-2] * 0x8f + (uint)pbVar10[-3] * 0x4d +
                     ((uint)bVar2 + (uint)bVar2 * 8) * 4 >> 8) * (EVar5 + BLEND_MODULATE);
            iVar7 = (uint)pbVar10[-3] * iVar11 + iVar8;
            iVar15 = (uint)pbVar10[-2] * iVar11 + iVar8;
            iVar8 = (uint)bVar2 * iVar11 + iVar8;
            uVar14 = (uint)bVar1;
            uVar9 = uVar14 ^ 0xff;
            pout[lVar6 * 4 + 2] =
                 (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar9 +
                               ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f)
                               & 0xff) * uVar14) * 0x1010102 >> 0x20);
            pout[lVar6 * 4 + 1] =
                 (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar9 +
                               ((uint)((ulong)((long)iVar15 * 0x84210843) >> 0x24) -
                                (iVar15 >> 0x1f) & 0xff) * uVar14) * 0x1010102 >> 0x20);
            pout[lVar6 * 4] =
                 (BYTE)((ulong)(pout[lVar6 * 4] * uVar9 +
                               ((uint)((ulong)((long)iVar8 * 0x84210843) >> 0x24) - (iVar8 >> 0x1f)
                               & 0xff) * uVar14) * 0x1010102 >> 0x20);
            pout[lVar6 * 4 + 3] = bVar1;
          }
          lVar6 = lVar6 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar6);
      }
    }
    else if (0 < count) {
      pbVar10 = pin + 3;
      lVar12 = 0;
      do {
        bVar1 = *pbVar10;
        if (bVar1 != 0) {
          uVar9 = (uint)pbVar10[-2] * 0x8f + (uint)pbVar10[-3] * 0x4d +
                  ((uint)pbVar10[-1] + (uint)pbVar10[-1] * 8) * 4;
          uVar14 = uVar9 >> 8;
          if (0xfe < uVar14) {
            uVar14 = 0xff;
          }
          uVar16 = (ulong)uVar14;
          if (uVar9 < 0x100) {
            uVar16 = 0;
          }
          bVar2 = *(byte *)((long)pFVar4 + uVar16 * 4 + lVar6 * 0x518 + -0xa700);
          bVar3 = *(byte *)((long)pFVar4 + uVar16 * 4 + lVar6 * 0x518 + -0xa6ff);
          uVar9 = (uint)bVar1;
          uVar14 = uVar9 ^ 0xff;
          pout[lVar12 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar12 * 4 + 2] * uVar14 +
                             *(byte *)((long)pFVar4 + uVar16 * 4 + lVar6 * 0x518 + -0xa6fe) * uVar9)
                      * 0x1010102 >> 0x20);
          pout[lVar12 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar12 * 4 + 1] * uVar14 + bVar3 * uVar9) * 0x1010102 >> 0x20);
          pout[lVar12 * 4] =
               (BYTE)((ulong)(pout[lVar12 * 4] * uVar14 + bVar2 * uVar9) * 0x1010102 >> 0x20);
          pout[lVar12 * 4 + 3] = bVar1;
        }
        lVar12 = lVar12 + 1;
        pbVar10 = pbVar10 + step;
      } while (count != (int)lVar12);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}